

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsHasProperty(JsValueRef object,JsPropertyIdRef propertyId,bool *hasProperty)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsErrorCode exitStatus;
  RecyclableObject *this;
  undefined4 *puVar5;
  JsrtContext *pJVar6;
  TTDJsRTActionResultAutoRecorder *this_00;
  Type TVar7;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_f8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  TTDRecorder local_b8;
  undefined1 local_a0 [8];
  EnterScriptObject __enterScriptObject;
  JsValueRef object_local;
  JsPropertyIdRef propertyId_local;
  JavascriptLibrary **ppJStack_60;
  bool **local_58;
  bool *local_48;
  bool *hasProperty_local;
  undefined4 *puStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (object == (JsValueRef)0x0) {
    exitStatus = JsErrorInvalidArgument;
  }
  else {
    __enterScriptObject.library = (JavascriptLibrary *)object;
    object_local = propertyId;
    local_48 = hasProperty;
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 == 0) {
      return JsErrorArgumentNotObject;
    }
    this = Js::VarTo<Js::RecyclableObject>(object);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00367710;
      *puVar5 = 0;
    }
    TVar7 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar7) && (BVar4 = Js::RecyclableObject::IsExternal(this), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                         "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00367710;
      *puVar5 = 0;
    }
    puStack_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while( true ) {
      if (TVar7 == TypeIds_Null) break;
      if (TVar7 == TypeIds_Proxy) {
        local_58 = &local_48;
        local_b8.m_actionEvent = (EventLogEntry *)0x0;
        local_b8.m_resultPtr = (TTDVar *)0x0;
        propertyId_local = (ScriptEntryExitRecord *)&object_local;
        ppJStack_60 = &__enterScriptObject.library;
        pJVar6 = JsrtContext::GetCurrent();
        if (pJVar6 == (JsrtContext *)0x0) {
          exitStatus = JsErrorNoCurrentContext;
        }
        else {
          pSVar1 = (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
                   ptr;
          AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)((long)&hasProperty_local + 4),
                     ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
          puVar5 = puStack_38;
          __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
          __entryExitRecord.scriptContext = (ScriptContext *)0x0;
          __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
          __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
          __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
          auStack_f8 = (undefined1  [8])0x0;
          __entryExitRecord._0_1_ = 0;
          __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
          __entryExitRecord._2_6_ = 0;
          Js::EnterScriptObject::EnterScriptObject
                    ((EnterScriptObject *)local_a0,pSVar1,(ScriptEntryExitRecord *)auStack_f8,
                     unaff_retaddr,&stack0x00000000,true,true,true);
          Js::ScriptContext::OnScriptStart(pSVar1,true,true);
          Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_a0);
          exitStatus = JsHasProperty::anon_class_24_3_132321e7::operator()
                                 ((anon_class_24_3_132321e7 *)&propertyId_local,pSVar1,&local_b8);
          Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_a0);
          if (((((exitStatus & 0x6ffff) == JsErrorOutOfMemory) ||
               ((exitStatus - JsErrorNoCurrentContext < 7 &&
                ((0x43U >> (exitStatus - JsErrorNoCurrentContext & 0x1f) & 1) != 0)))) ||
              (exitStatus == JsErrorFatal)) || (exitStatus == JsErrorScriptTerminated)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                               ,0xcc,
                               "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                               ,
                               "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                              );
            if (!bVar3) goto LAB_00367710;
            *puVar5 = 0;
          }
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)((long)&hasProperty_local + 4));
        }
        this_00 = &local_b8;
        goto LAB_00367233;
      }
      this = Js::RecyclableObject::GetPrototype(this);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = puStack_38;
        *puStack_38 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00367710;
        *puVar5 = 0;
      }
      TVar7 = ((this->type).ptr)->typeId;
      if ((0x57 < (int)TVar7) && (BVar4 = Js::RecyclableObject::IsExternal(this), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = puStack_38;
        *puStack_38 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00367710;
        *puVar5 = 0;
      }
    }
    __enterScriptObject._8_8_ = &local_48;
    propertyId_local = (JsPropertyIdRef)0x0;
    ppJStack_60 = (JavascriptLibrary **)0x0;
    local_a0 = (undefined1  [8])&object_local;
    __enterScriptObject.entryExitRecord = (ScriptEntryExitRecord *)&__enterScriptObject.library;
    pJVar6 = JsrtContext::GetCurrent();
    if (pJVar6 == (JsrtContext *)0x0) {
      exitStatus = JsErrorNoCurrentContext;
    }
    else {
      pSVar1 = (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)auStack_f8,
                 ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      puVar5 = puStack_38;
      exitStatus = JsHasProperty::anon_class_24_3_132321e7::operator()
                             ((anon_class_24_3_132321e7 *)local_a0,pSVar1,
                              (TTDRecorder *)&propertyId_local);
      if ((((exitStatus - JsErrorNoCurrentContext < 7) &&
           ((0x43U >> (exitStatus - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) ||
          (exitStatus == JsErrorOutOfMemory)) ||
         ((exitStatus == JsErrorFatal || ((exitStatus & 0xfffffffd) == JsErrorScriptException)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                           ,0x11f,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && (scriptExceptionAllowed || errCode != JsErrorScriptException) && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar3) {
LAB_00367710:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)auStack_f8);
    }
    this_00 = (TTDJsRTActionResultAutoRecorder *)&propertyId_local;
LAB_00367233:
    TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode(this_00,exitStatus);
  }
  return exitStatus;
}

Assistant:

CHAKRA_API JsHasProperty(_In_ JsValueRef object, _In_ JsPropertyIdRef propertyId, _Out_ bool *hasProperty)
{
    VALIDATE_JSREF(object);
    if (!Js::JavascriptOperators::IsObject(object)) return JsErrorArgumentNotObject;

    auto internalHasProperty = [&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTHasProperty, (Js::PropertyRecord *)propertyId, object);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(hasProperty);
        *hasProperty = false;

        Js::RecyclableObject * instance = Js::VarTo<Js::RecyclableObject>(object);
        *hasProperty = Js::JavascriptOperators::HasProperty(instance, ((Js::PropertyRecord *)propertyId)->GetPropertyId()) != 0;

        return JsNoError;
    };

    Js::RecyclableObject* robject = Js::VarTo<Js::RecyclableObject>(object);
    Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(robject);
    while (typeId != Js::TypeIds_Null && typeId != Js::TypeIds_Proxy)
    {
        robject = robject->GetPrototype();
        typeId = Js::JavascriptOperators::GetTypeId(robject);
    }

    if (typeId == Js::TypeIds_Proxy)
    {
        return ContextAPIWrapper<JSRT_MAYBE_TRUE>(internalHasProperty);
    }
#ifdef _CHAKRACOREBUILD
    else if (typeId == Js::TypeIds_Object)
    {
        // CEOs can also have traps so we would want the Enter/Leave semantics for those.
        Js::CustomExternalWrapperObject * externalWrapper = Js::JavascriptOperators::TryFromVar<Js::CustomExternalWrapperObject>(object);
        if (externalWrapper)
        {
            return ContextAPIWrapper<JSRT_MAYBE_TRUE>(internalHasProperty);
        }
    }
#endif

    return ContextAPINoScriptWrapper(internalHasProperty);
}